

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# check.h
# Opt level: O0

void ThrowXrResult(XrResult res,char *originator,char *sourceLocation)

{
  char *pcVar1;
  string local_40 [32];
  char *local_20;
  char *sourceLocation_local;
  char *originator_local;
  XrResult res_local;
  
  local_20 = sourceLocation;
  sourceLocation_local = originator;
  originator_local._4_4_ = res;
  pcVar1 = to_string(res);
  Fmt_abi_cxx11_((char *)local_40,"XrResult failure [%s]",pcVar1);
  Throw(local_40,sourceLocation_local,local_20);
}

Assistant:

[[noreturn]] inline void ThrowXrResult(XrResult res, const char* originator = nullptr, const char* sourceLocation = nullptr) {
    Throw(Fmt("XrResult failure [%s]", to_string(res)), originator, sourceLocation);
}